

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_comment_c(CPState *cp)

{
  byte *pbVar1;
  int iVar2;
  CPState *cp_local;
  int local_1c;
  
  do {
    pbVar1 = (byte *)cp->p;
    cp->p = (char *)(pbVar1 + 1);
    cp->c = (uint)*pbVar1;
    if (cp->c == 0x5c) {
      iVar2 = cp_get_bs(cp);
    }
    else {
      iVar2 = cp->c;
    }
    while (iVar2 == 0x2a) {
      pbVar1 = (byte *)cp->p;
      cp->p = (char *)(pbVar1 + 1);
      cp->c = (uint)*pbVar1;
      if (cp->c == 0x5c) {
        local_1c = cp_get_bs(cp);
      }
      else {
        local_1c = cp->c;
      }
      if (local_1c == 0x2f) {
        pbVar1 = (byte *)cp->p;
        cp->p = (char *)(pbVar1 + 1);
        cp->c = (uint)*pbVar1;
        if (cp->c != 0x5c) {
          return;
        }
        cp_get_bs(cp);
        return;
      }
      iVar2 = cp->c;
    }
    if (cp->c == 10 || cp->c == 0xd) {
      cp_newline(cp);
    }
  } while (cp->c != 0);
  return;
}

Assistant:

static void cp_comment_c(CPState *cp)
{
  do {
    if (cp_get(cp) == '*') {
      do {
	if (cp_get(cp) == '/') { cp_get(cp); return; }
      } while (cp->c == '*');
    }
    if (cp_iseol(cp->c)) cp_newline(cp);
  } while (cp->c != '\0');
}